

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O2

void __thiscall Wasm::WasmBinaryReader::ReadImportSection(WasmBinaryReader *this)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  uint sigId;
  uint sourceContextId;
  LocalFunctionId functionId;
  WasmType type;
  uint32 uVar4;
  char16_t *msg;
  WebAssemblyModule *this_00;
  FunctionBody *pFVar5;
  WasmBinaryReader *pWVar6;
  ulong uVar7;
  WasmBinaryReader *local_58;
  uint32 local_50;
  uint local_4c;
  uint32 len;
  char16 *local_40;
  uint32 local_38;
  uint32 local_34;
  uint32 modNameLen;
  uint32 fnNameLen;
  
  local_50 = 0;
  this_00 = (WebAssemblyModule *)this;
  uVar3 = LEB128<unsigned_int,32u>(this,&local_50);
  if ((100000 < uVar3) && (DAT_01430302 == '\0')) {
    msg = L"Too many imports";
LAB_00d6354a:
    ThrowDecodingError((WasmBinaryReader *)this_00,msg);
  }
  local_58 = (WasmBinaryReader *)&DAT_01453738;
  local_4c = 0;
  do {
    if (uVar3 == local_4c) {
      return;
    }
    local_38 = 0;
    local_34 = 0;
    _len = ReadInlineName(this,&local_50,&local_38);
    local_40 = ReadInlineName(this,&local_50,&local_34);
    bVar1 = ReadConst<unsigned_char>(this);
    pFVar5 = (this->m_funcState).body;
    uVar7 = (ulong)bVar1;
    pWVar6 = local_58;
    if (pFVar5 == (FunctionBody *)0x0 || this->m_readerState != READER_STATE_FUNCTION) {
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,WasmReaderPhase);
      if (bVar2) {
LAB_00d63358:
        Output::Print(L"Import #%u: \"%s\".\"%s\", kind: %d",(ulong)local_4c,_len,local_40,uVar7);
        pWVar6 = (WasmBinaryReader *)0xdfdeb2;
        Output::Print(L"\n");
        Output::Flush();
      }
    }
    else {
      sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar5);
      if (this->m_readerState == READER_STATE_FUNCTION) {
        pFVar5 = (this->m_funcState).body;
      }
      else {
        pFVar5 = (FunctionBody *)0x0;
      }
      functionId = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar5);
      bVar2 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_01453738,WasmReaderPhase,sourceContextId,functionId);
      if (bVar2) goto LAB_00d63358;
    }
    switch(uVar7) {
    case 0:
      sigId = LEB128<unsigned_int,32u>(this,&local_50);
      Js::WebAssemblyModule::AddFunctionImport(this->m_module,sigId,_len,local_38,local_40,local_34)
      ;
      this_00 = this->m_module;
      uVar4 = Js::WebAssemblyModule::GetWasmFunctionCount(this_00);
      if ((1000000 < uVar4) && (DAT_01430302 == '\0')) {
        msg = L"Too many functions";
        goto LAB_00d6354a;
      }
      break;
    case 1:
      ReadTableSection(this,true);
      Js::WebAssemblyModule::AddTableImport(this->m_module,_len,local_38,local_40,local_34);
      break;
    case 2:
      ReadMemorySection(this,true);
      Js::WebAssemblyModule::AddMemoryImport(this->m_module,_len,local_38,local_40,local_34);
      break;
    case 3:
      type = ReadWasmType(this,&local_50);
      this_00 = (WebAssemblyModule *)this;
      bVar2 = ReadMutableValue(this);
      if (bVar2) {
        msg = L"Mutable globals cannot be imported";
        goto LAB_00d6354a;
      }
      Js::WebAssemblyModule::AddGlobal
                (this->m_module,ImportedReference,type,false,(WasmNode)ZEXT1632(ZEXT816(0)));
      Js::WebAssemblyModule::AddGlobalImport(this->m_module,_len,local_38,local_40,local_34);
      this_00 = this->m_module;
      uVar4 = Js::WebAssemblyModule::GetGlobalCount(this_00);
      if ((1000000 < uVar4) && (DAT_01430302 == '\0')) {
        msg = L"Too many globals";
        goto LAB_00d6354a;
      }
      break;
    default:
      ThrowDecodingError(pWVar6,L"Imported Kind %d, NYI",uVar7);
    }
    local_4c = local_4c + 1;
  } while( true );
}

Assistant:

void WasmBinaryReader::ReadImportSection()
{
    uint32 len = 0;
    uint32 numImports = LEB128(len);

    if (numImports > Limits::GetMaxImports())
    {
        ThrowDecodingError(_u("Too many imports"));
    }

    for (uint32 i = 0; i < numImports; ++i)
    {
        uint32 modNameLen = 0, fnNameLen = 0;
        const char16* modName = ReadInlineName(len, modNameLen);
        const char16* fnName = ReadInlineName(len, fnNameLen);

        ExternalKinds kind = ReadExternalKind();
        TRACE_WASM_DECODER(_u("Import #%u: \"%s\".\"%s\", kind: %d"), i, modName, fnName, kind);
        switch (kind)
        {
        case ExternalKinds::Function:
        {
            uint32 sigId = LEB128(len);
            m_module->AddFunctionImport(sigId, modName, modNameLen, fnName, fnNameLen);
            if (m_module->GetWasmFunctionCount() > Limits::GetMaxFunctions())
            {
                ThrowDecodingError(_u("Too many functions"));
            }
            break;
        }
        case ExternalKinds::Global:
        {
            WasmTypes::WasmType type = ReadWasmType(len);
            bool isMutable = ReadMutableValue();
            if (isMutable)
            {
                ThrowDecodingError(_u("Mutable globals cannot be imported"));
            }
            m_module->AddGlobal(GlobalReferenceTypes::ImportedReference, type, isMutable, {});
            m_module->AddGlobalImport(modName, modNameLen, fnName, fnNameLen);
            if (m_module->GetGlobalCount() > Limits::GetMaxGlobals())
            {
                ThrowDecodingError(_u("Too many globals"));
            }
            break;
        }
        case ExternalKinds::Table:
            ReadTableSection(true);
            m_module->AddTableImport(modName, modNameLen, fnName, fnNameLen);
            break;
        case ExternalKinds::Memory:
            ReadMemorySection(true);
            m_module->AddMemoryImport(modName, modNameLen, fnName, fnNameLen);

            break;
        default:
            ThrowDecodingError(_u("Imported Kind %d, NYI"), kind);
            break;
        }
    }
}